

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::hasFastAccess
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x157f4ca);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::hasFastAccess
                        ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)0x157f4e6);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}